

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_utils.cpp
# Opt level: O0

void * zmq_threadstart(undefined1 *func_,void *arg_)

{
  thread_t *ptVar1;
  thread_t *thread;
  thread_t *ptVar2;
  void *in_stack_ffffffffffffffd0;
  thread_fn *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar3;
  
  ptVar1 = (thread_t *)operator_new(0x68,(nothrow_t *)&std::nothrow);
  uVar3 = 0;
  ptVar2 = (thread_t *)0x0;
  if (ptVar1 != (thread_t *)0x0) {
    uVar3 = 1;
    zmq::thread_t::thread_t(ptVar1);
    ptVar2 = ptVar1;
  }
  ptVar1 = ptVar2;
  if (ptVar2 == (thread_t *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmq_utils.cpp"
            ,0x56);
    fflush(_stderr);
    zmq::zmq_abort((char *)0x21bdc0);
  }
  zmq::thread_t::start
            ((thread_t *)CONCAT17(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,(char *)ptVar1);
  return ptVar2;
}

Assistant:

void *zmq_threadstart (zmq_thread_fn *func_, void *arg_)
{
    zmq::thread_t *thread = new (std::nothrow) zmq::thread_t;
    alloc_assert (thread);
    thread->start (func_, arg_, "ZMQapp");
    return thread;
}